

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O2

void duckdb_je_tsd_cleanup(void *arg)

{
  int iVar1;
  void *__dest;
  
  if ((0x2bU >> (*(byte *)((long)arg + 0x338) & 0x1f) & 1) != 0) {
    duckdb_je_prof_tdata_cleanup((tsd_t *)arg);
    duckdb_je_iarena_cleanup((tsd_t *)arg);
    duckdb_je_arena_cleanup((tsd_t *)arg);
    duckdb_je_tcache_cleanup((tsd_t *)arg);
    duckdb_je_witnesses_cleanup((witness_tsd_t *)((long)arg + 0xa40));
    *(undefined1 *)((long)arg + 1) = 1;
    duckdb_je_tsd_state_set((tsd_t *)arg,'\x04');
    __dest = (void *)__tls_get_addr(&PTR_027efab8);
    if (__dest != arg) {
      switchD_016b0717::default(__dest,arg,0xa50);
    }
    iVar1 = pthread_setspecific(duckdb_je_tsd_tsd,__dest);
    if (iVar1 != 0) {
      duckdb_je_malloc_write("<jemalloc>: Error setting tsd.\n");
      if (duckdb_je_opt_abort == true) {
        abort();
      }
    }
  }
  return;
}

Assistant:

void
tsd_cleanup(void *arg) {
	tsd_t *tsd = (tsd_t *)arg;

	switch (tsd_state_get(tsd)) {
	case tsd_state_uninitialized:
		/* Do nothing. */
		break;
	case tsd_state_minimal_initialized:
		/* This implies the thread only did free() in its life time. */
		/* Fall through. */
	case tsd_state_reincarnated:
		/*
		 * Reincarnated means another destructor deallocated memory
		 * after the destructor was called.  Cleanup isn't required but
		 * is still called for testing and completeness.
		 */
		assert_tsd_data_cleanup_done(tsd);
		JEMALLOC_FALLTHROUGH;
	case tsd_state_nominal:
	case tsd_state_nominal_slow:
		tsd_do_data_cleanup(tsd);
		tsd_state_set(tsd, tsd_state_purgatory);
		tsd_set(tsd);
		break;
	case tsd_state_purgatory:
		/*
		 * The previous time this destructor was called, we set the
		 * state to tsd_state_purgatory so that other destructors
		 * wouldn't cause re-creation of the tsd.  This time, do
		 * nothing, and do not request another callback.
		 */
		break;
	default:
		not_reached();
	}
#ifdef JEMALLOC_JET
	test_callback_t test_callback = *tsd_test_callbackp_get_unsafe(tsd);
	int *data = tsd_test_datap_get_unsafe(tsd);
	if (test_callback != NULL) {
		test_callback(data);
	}
#endif
}